

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedFixedWingAircraft.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_EnhancedFixedWingAircraft::Encode
          (GED_EnhancedFixedWingAircraft *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  GED_EnhancedFixedWingAircraft *this_local;
  
  GED_BasicFixedWingAircraft::Encode(&this->super_GED_BasicFixedWingAircraft,stream);
  pKVar1 = KDataStream::operator<<(stream,this->m_ui8SupFuelStatus);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8AirMaintStatus);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8PriAmmun);
  KDataStream::operator<<(pKVar1,this->m_ui8SecAmmun);
  return;
}

Assistant:

void GED_EnhancedFixedWingAircraft::Encode( KDataStream & stream ) const
{
    GED_BasicFixedWingAircraft::Encode( stream );

    stream << m_ui8SupFuelStatus
           << m_ui8AirMaintStatus
           << m_ui8PriAmmun
           << m_ui8SecAmmun;
}